

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O3

PLYElement * gvr::PLYElement::fromString(string *s)

{
  int iVar1;
  PLYElement *this;
  IOException *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  long n;
  istringstream in;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  long local_1a0;
  string local_198 [3];
  ios_base local_120 [264];
  
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  gutil::split(&local_1b8,s,' ',true);
  iVar1 = std::__cxx11::string::compare
                    ((char *)local_1b8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  if (iVar1 == 0) {
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_198,
               (string *)
               (local_1b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 2),_S_in);
    std::istream::_M_extract<long>((long *)local_198);
    this = (PLYElement *)operator_new(0x40);
    PLYElement(this,local_1b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1,local_1a0);
    std::__cxx11::istringstream::~istringstream((istringstream *)local_198);
    std::ios_base::~ios_base(local_120);
  }
  else {
    iVar1 = std::__cxx11::string::compare
                      ((char *)local_1b8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
    if (iVar1 != 0) {
      this_00 = (IOException *)__cxa_allocate_exception(0x28);
      std::operator+(local_198,"Invalid PLY element definition: ",s);
      gutil::IOException::IOException(this_00,local_198);
      __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
    }
    this = (PLYElement *)operator_new(0x40);
    std::__cxx11::string::substr((ulong)local_198,(ulong)s);
    PLYElement(this,local_198,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198[0]._M_dataplus._M_p != &local_198[0].field_2) {
      operator_delete(local_198[0]._M_dataplus._M_p);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b8);
  return this;
}

Assistant:

PLYElement *PLYElement::fromString(const std::string &s)
{
  std::vector<std::string> list;

  gutil::split(list, s);

  if (list[0].compare("element") == 0)
  {
    long n;
    std::istringstream in(list[2]);
    in >> n;

    return new PLYElement(list[1], n);
  }
  else if (list[0].compare("comment") == 0)
  {
    return new PLYElement(s.substr(8), -1);
  }
  else
  {
    throw gutil::IOException("Invalid PLY element definition: "+s);
  }
}